

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_deflate(uchar **out,size_t *outsize,uchar *in,size_t insize,
                    LodePNGCompressSettings *settings)

{
  undefined1 auVar1 [64];
  size_t __size;
  size_t sVar2;
  undefined8 uVar3;
  unsigned_short *puVar4;
  undefined8 uVar5;
  uchar *puVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int *__s;
  int *piVar10;
  int *__s_00;
  long lVar11;
  uchar *puVar12;
  uchar *puVar13;
  uint *puVar14;
  uint *puVar15;
  ulong uVar16;
  ulong uVar17;
  uchar uVar18;
  size_t sVar19;
  long lVar20;
  ulong uVar21;
  uint *puVar22;
  int iVar23;
  ulong uVar24;
  size_t sVar25;
  ulong uVar26;
  ulong uVar27;
  int iVar28;
  ulong uVar29;
  uint *puVar30;
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  ucvector local_260;
  uint *local_248;
  uint *local_240;
  uchar *local_238;
  size_t local_230;
  undefined1 local_228 [16];
  size_t local_218;
  size_t local_210;
  uchar **local_208;
  uint *local_200;
  ulong *local_1f8;
  ulong local_1f0;
  LodePNGCompressSettings *local_1e8;
  uint *local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  HuffmanTree tree_ll;
  undefined1 local_188 [16];
  size_t local_178;
  HuffmanTree tree_d;
  HuffmanTree tree_cl;
  undefined1 local_108 [16];
  size_t local_f8;
  unsigned_short *local_e8;
  int *local_e0;
  unsigned_short *local_d8;
  unsigned_short *local_d0;
  undefined1 local_c8 [16];
  size_t local_b8;
  int *local_b0;
  undefined1 local_a8 [64];
  Hash local_60;
  
  local_260.data = *out;
  local_260.size = *outsize;
  local_230 = 0;
  uVar7 = settings->btype;
  uVar8 = 0x3d;
  if (uVar7 < 3) {
    sVar25 = insize;
    local_260.allocsize = local_260.size;
    local_210 = insize;
    local_208 = out;
    local_1f8 = outsize;
    if (uVar7 != 1) {
      if (uVar7 == 0) {
        if (insize + 0xfffe < 0xffff) {
          uVar8 = 0;
        }
        else {
          local_1d8 = (insize + 0xfffe) / 0xffff;
          uVar29 = 0;
          local_1e8 = (LodePNGCompressSettings *)((ulong)settings & 0xffffffff00000000);
          uVar24 = local_1d8 - 1;
          do {
            puVar30 = (uint *)local_260.allocsize;
            sVar25 = local_260.size;
            puVar13 = local_260.data;
            puVar14 = (uint *)(local_260.size + 1);
            puVar12 = local_260.data;
            puVar15 = (uint *)local_260.allocsize;
            if (local_260.allocsize < puVar14) {
              puVar15 = (uint *)((ulong)((long)puVar14 * 3) >> 1);
              if ((uint *)(local_260.allocsize * 2) < puVar14) {
                puVar15 = puVar14;
              }
              puVar12 = (uchar *)realloc(local_260.data,(size_t)puVar15);
              insize = local_210;
              puVar22 = puVar14;
              if (puVar12 != (uchar *)0x0) goto LAB_004caffb;
            }
            else {
LAB_004caffb:
              local_260.allocsize = (size_t)puVar15;
              local_260.data = puVar12;
              local_260.data[sVar25] = uVar29 == uVar24;
              puVar22 = (uint *)(sVar25 + 2);
              puVar13 = local_260.data;
              puVar30 = (uint *)local_260.allocsize;
              local_260.size = (size_t)puVar14;
            }
            local_a8._0_8_ = (ulong)local_1e8 & 0xffffffff;
            iVar28 = (int)insize - (int)local_1e8;
            if (0xfffe < insize - local_a8._0_8_) {
              iVar28 = 0xffff;
            }
            uVar26 = local_a8._0_8_;
            puVar12 = puVar13;
            puVar6 = local_260.data;
            puVar14 = (uint *)local_260.allocsize;
            if (puVar30 < puVar22) {
              puVar14 = (uint *)((ulong)((long)puVar22 * 3) >> 1);
              if ((uint *)((long)puVar30 * 2) < puVar22) {
                puVar14 = puVar22;
              }
              puVar12 = (uchar *)realloc(puVar13,(size_t)puVar14);
              insize = local_210;
              puVar15 = puVar22;
              uVar26 = local_a8._0_8_;
              puVar6 = puVar12;
              if (puVar12 != (uchar *)0x0) goto LAB_004cb08d;
            }
            else {
LAB_004cb08d:
              local_260.allocsize = (size_t)puVar14;
              local_260.data = puVar6;
              (puVar12 + -1)[(long)puVar22] = (uchar)iVar28;
              puVar13 = local_260.data;
              puVar15 = (uint *)((long)puVar22 + 1);
              puVar30 = (uint *)local_260.allocsize;
              local_260.size = (size_t)puVar22;
            }
            puVar12 = puVar13;
            puVar6 = local_260.data;
            puVar14 = (uint *)local_260.allocsize;
            if (puVar30 < puVar15) {
              puVar14 = (uint *)((ulong)((long)puVar15 * 3) >> 1);
              if ((uint *)((long)puVar30 * 2) < puVar15) {
                puVar14 = puVar15;
              }
              puVar12 = (uchar *)realloc(puVar13,(size_t)puVar14);
              insize = local_210;
              puVar22 = puVar15;
              uVar26 = local_a8._0_8_;
              puVar6 = puVar12;
              if (puVar12 != (uchar *)0x0) goto LAB_004cb0f2;
            }
            else {
LAB_004cb0f2:
              local_260.allocsize = (size_t)puVar14;
              local_260.data = puVar6;
              (puVar12 + -1)[(long)puVar15] = (uchar)((uint)iVar28 >> 8);
              puVar22 = (uint *)((long)puVar15 + 1);
              puVar13 = local_260.data;
              puVar30 = (uint *)local_260.allocsize;
              local_260.size = (size_t)puVar15;
            }
            puVar12 = puVar13;
            iVar23 = 0xffff - iVar28;
            puVar6 = local_260.data;
            puVar14 = (uint *)local_260.allocsize;
            if (puVar30 < puVar22) {
              local_1f0 = CONCAT44(local_1f0._4_4_,0xffff - iVar28);
              puVar14 = (uint *)((ulong)((long)puVar22 * 3) >> 1);
              if ((uint *)((long)puVar30 * 2) < puVar22) {
                puVar14 = puVar22;
              }
              puVar12 = (uchar *)realloc(puVar13,(size_t)puVar14);
              insize = local_210;
              puVar15 = puVar22;
              uVar26 = local_a8._0_8_;
              iVar23 = (int)local_1f0;
              puVar6 = puVar12;
              if (puVar12 != (uchar *)0x0) goto LAB_004cb162;
            }
            else {
LAB_004cb162:
              local_260.allocsize = (size_t)puVar14;
              local_260.data = puVar6;
              (puVar12 + -1)[(long)puVar22] = (uchar)iVar23;
              puVar13 = local_260.data;
              puVar15 = (uint *)((long)puVar22 + 1);
              puVar30 = (uint *)local_260.allocsize;
              local_260.size = (size_t)puVar22;
            }
            uVar27 = local_1d8;
            puVar12 = local_260.data;
            puVar14 = (uint *)local_260.allocsize;
            if (puVar30 < puVar15) {
              puVar14 = (uint *)((ulong)((long)puVar15 * 3) >> 1);
              if ((uint *)((long)puVar30 * 2) < puVar15) {
                puVar14 = puVar15;
              }
              puVar13 = (uchar *)realloc(puVar13,(size_t)puVar14);
              insize = local_210;
              uVar26 = local_a8._0_8_;
              puVar12 = puVar13;
              if (puVar13 != (uchar *)0x0) goto LAB_004cb1ca;
            }
            else {
LAB_004cb1ca:
              local_260.allocsize = (size_t)puVar14;
              local_260.data = puVar12;
              (puVar13 + -1)[(long)puVar15] = (uchar)((uint)iVar23 >> 8);
              local_260.size = (size_t)puVar15;
            }
            if (uVar26 < insize) {
              puVar14 = (uint *)local_260.size;
              uVar27 = uVar26;
              puVar13 = local_260.data;
              uVar17 = 0;
              puVar30 = (uint *)local_260.allocsize;
              local_1f0 = uVar29;
              do {
                puVar15 = (uint *)((long)puVar14 + 1);
                uVar18 = in[uVar26];
                puVar12 = puVar13;
                puVar22 = puVar30;
                if (puVar30 < puVar15) {
                  local_1e8 = (LodePNGCompressSettings *)CONCAT71(local_1e8._1_7_,uVar18);
                  puVar22 = (uint *)((ulong)((long)puVar15 * 3) >> 1);
                  if ((uint *)((long)puVar30 * 2) < puVar15) {
                    puVar22 = puVar15;
                  }
                  puVar12 = (uchar *)realloc(puVar13,(size_t)puVar22);
                  insize = local_210;
                  uVar27 = local_a8._0_8_;
                  uVar18 = (uchar)local_1e8;
                  if (puVar12 != (uchar *)0x0) goto LAB_004cb250;
                }
                else {
LAB_004cb250:
                  (puVar12 + -1)[(long)puVar15] = uVar18;
                  puVar14 = puVar15;
                  puVar13 = puVar12;
                  puVar30 = puVar22;
                }
                uVar29 = uVar17 + 1;
              } while ((uVar17 < 0xfffe) &&
                      (uVar26 = uVar27 + 1 + uVar17 & 0xffffffff, uVar17 = uVar29, uVar26 < insize))
              ;
              local_1e8 = (LodePNGCompressSettings *)
                          CONCAT44(local_1e8._4_4_,(int)uVar27 + (int)uVar29);
              uVar27 = local_1d8;
              uVar29 = local_1f0;
              local_260.data = puVar13;
              local_260.size = (size_t)puVar14;
              local_260.allocsize = (size_t)puVar30;
            }
            uVar29 = uVar29 + 1;
          } while (uVar29 != uVar27);
          uVar8 = 0;
          out = local_208;
          outsize = local_1f8;
        }
        goto LAB_004cc28e;
      }
      uVar24 = 0xfff8;
      if (0xfff8 < insize >> 3) {
        uVar24 = insize >> 3;
      }
      if (0x3fff7 < uVar24) {
        uVar24 = 0x3fff8;
      }
      sVar25 = uVar24 + 8;
    }
    uVar29 = (ulong)settings->windowsize;
    uVar24 = 1;
    if (!CARRY8(insize - 1,sVar25)) {
      uVar24 = ((insize - 1) + sVar25) / sVar25;
    }
    local_1e8 = settings;
    __s = (int *)malloc(0x40000);
    local_60.head = __s;
    piVar10 = (int *)malloc(uVar29 * 4);
    __size = uVar29 * 2;
    local_60.val = piVar10;
    local_d0 = (unsigned_short *)malloc(__size);
    local_60.chain = local_d0;
    local_d8 = (unsigned_short *)malloc(__size);
    local_60.zeros = local_d8;
    __s_00 = (int *)malloc(0x40c);
    local_60.headz = __s_00;
    local_e8 = (unsigned_short *)malloc(__size);
    puVar4 = local_d0;
    out = local_208;
    uVar8 = 0x53;
    uVar7 = 0x53;
    if (((((piVar10 != (int *)0x0) && (__s != (int *)0x0)) && (local_d0 != (unsigned_short *)0x0))
        && ((uVar8 = uVar7, local_d8 != (unsigned_short *)0x0 && (__s_00 != (int *)0x0)))) &&
       (local_e8 != (unsigned_short *)0x0)) {
      local_e0 = piVar10;
      local_60.chainz = local_e8;
      memset(__s,0xff,0x40000);
      if (uVar29 == 0) {
        memset(__s_00,0xff,0x40c);
      }
      else {
        memset(local_e0,0xff,uVar29 * 4);
        auVar31 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
        auVar32 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
        auVar33 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar34 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar35 = vpmovsxbw_avx512bw(_DAT_00a26bc0);
        auVar36 = vpbroadcastq_avx512f(ZEXT816(0x20));
        auVar37 = vpbroadcastw_avx512bw(ZEXT216(0x20));
        lVar11 = 0;
        auVar38 = vpbroadcastq_avx512f();
        lVar20 = (uVar29 + 0x1f >> 5) * 0x40;
        do {
          vpcmpuq_avx512f(auVar34,auVar38,2);
          vpcmpuq_avx512f(auVar33,auVar38,2);
          vpcmpuq_avx512f(auVar31,auVar38,2);
          auVar34 = vpaddq_avx512f(auVar34,auVar36);
          auVar33 = vpaddq_avx512f(auVar33,auVar36);
          auVar31 = vpaddq_avx512f(auVar31,auVar36);
          vpcmpuq_avx512f(auVar32,auVar38,2);
          auVar32 = vpaddq_avx512f(auVar32,auVar36);
          auVar1 = vmovdqu16_avx512bw(auVar35);
          *(undefined1 (*) [64])((long)puVar4 + lVar11) = auVar1;
          auVar35 = vpaddw_avx512bw(auVar35,auVar37);
          lVar11 = lVar11 + 0x40;
        } while (lVar20 != lVar11);
        local_a8 = vmovdqu64_avx512f(auVar38);
        memset(__s_00,0xff,0x40c);
        auVar31 = vpbroadcastw_avx512bw(ZEXT216(0x20));
        auVar32 = vpbroadcastq_avx512f(ZEXT816(0x20));
        auVar33 = vmovdqu64_avx512f(local_a8);
        auVar34 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
        auVar35 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
        auVar36 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar37 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar38 = vpmovsxbw_avx512bw(_DAT_00a26bc0);
        lVar11 = 0;
        do {
          vpcmpuq_avx512f(auVar37,auVar33,2);
          vpcmpuq_avx512f(auVar36,auVar33,2);
          vpcmpuq_avx512f(auVar34,auVar33,2);
          auVar37 = vpaddq_avx512f(auVar37,auVar32);
          auVar36 = vpaddq_avx512f(auVar36,auVar32);
          auVar34 = vpaddq_avx512f(auVar34,auVar32);
          vpcmpuq_avx512f(auVar35,auVar33,2);
          auVar35 = vpaddq_avx512f(auVar35,auVar32);
          auVar1 = vmovdqu16_avx512bw(auVar38);
          *(undefined1 (*) [64])((long)local_e8 + lVar11) = auVar1;
          auVar38 = vpaddw_avx512bw(auVar38,auVar31);
          lVar11 = lVar11 + 0x40;
        } while (lVar20 != lVar11);
      }
      local_b0 = __s;
      if (uVar24 != 0) {
        lVar11 = 0;
        uVar27 = 0;
        uVar29 = local_210;
        uVar26 = sVar25;
        puVar13 = in;
LAB_004cb36c:
        uVar17 = uVar26;
        if (uVar29 < uVar26) {
          uVar17 = uVar29;
        }
        uVar21 = uVar27 * sVar25;
        uVar16 = uVar21 + sVar25;
        if (uVar29 <= uVar21 + sVar25) {
          uVar16 = uVar29;
        }
        uVar7 = (uint)(uVar27 == uVar24 - 1);
        if (local_1e8->btype == 2) {
          local_f8 = 0;
          tree_ll.lengths = (uint *)0x0;
          tree_d.lengths = (uint *)0x0;
          tree_cl.lengths = (uint *)0x0;
          local_178 = 0;
          local_218 = 0;
          local_b8 = 0;
          local_240 = (uint *)CONCAT44(local_240._4_4_,uVar7);
          local_a8._0_8_ = lVar11;
          local_108 = (undefined1  [16])0x0;
          tree_ll.tree2d = (uint *)0x0;
          tree_ll.tree1d = (uint *)0x0;
          tree_d.tree2d = (uint *)0x0;
          tree_d.tree1d = (uint *)0x0;
          tree_cl.tree2d = (uint *)0x0;
          tree_cl.tree1d = (uint *)0x0;
          local_188 = (undefined1  [16])0x0;
          local_228 = (undefined1  [16])0x0;
          local_c8 = (undefined1  [16])0x0;
          if (local_1e8->use_lz77 == 0) {
            local_1f0 = uVar27;
            local_1d8 = uVar26;
            uVar7 = uivector_resize((uivector *)local_108,uVar16 - uVar21);
            if (uVar7 == 0) {
              local_248 = (uint *)CONCAT44(local_248._4_4_,0x53);
              goto LAB_004cb998;
            }
            if (uVar21 < uVar16) {
              lVar20 = 0;
              do {
                *(uint *)(local_108._0_8_ + lVar20 * 4) = (uint)puVar13[lVar20];
                lVar20 = lVar20 + 1;
              } while (uVar17 + lVar11 != lVar20);
            }
LAB_004cb5d1:
            puVar14 = (uint *)calloc(1,0x478);
            local_248 = (uint *)CONCAT44(local_248._4_4_,0x53);
            if (puVar14 == (uint *)0x0) goto LAB_004cb998;
            puVar30 = (uint *)calloc(1,0x78);
            if (puVar30 == (uint *)0x0) goto LAB_004cb99b;
            if (local_108._8_8_ != 0) {
              sVar19 = 0;
              do {
                uVar7 = *(uint *)(local_108._0_8_ + sVar19 * 4);
                puVar14[uVar7] = puVar14[uVar7] + 1;
                if (0x100 < (ulong)uVar7) {
                  lVar11 = sVar19 + 2;
                  sVar19 = sVar19 + 3;
                  puVar30[*(uint *)(local_108._0_8_ + lVar11 * 4)] =
                       puVar30[*(uint *)(local_108._0_8_ + lVar11 * 4)] + 1;
                }
                sVar19 = sVar19 + 1;
              } while (sVar19 != local_108._8_8_);
            }
            puVar14[0x100] = 1;
            uVar7 = HuffmanTree_makeFromFrequencies(&tree_ll,puVar14,0x101,0x11e,0xf);
            if ((uVar7 == 0) &&
               (uVar7 = HuffmanTree_makeFromFrequencies(&tree_d,puVar30,2,0x1e,0xf),
               uVar8 = tree_d.numcodes, puVar15 = tree_ll.lengths, uVar7 == 0)) {
              local_200 = (uint *)0x11e;
              if (tree_ll.numcodes < 0x11e) {
                local_200 = (uint *)(ulong)tree_ll.numcodes;
              }
              uVar29 = 0x1e;
              if (tree_d.numcodes < 0x1e) {
                uVar29 = (ulong)tree_d.numcodes;
              }
              local_238 = puVar13;
              local_1e0 = puVar30;
              if (tree_ll.numcodes != 0) {
                puVar30 = (uint *)0x0;
                do {
                  uVar7 = puVar15[(long)puVar30];
                  uVar9 = uivector_resize((uivector *)local_188,local_188._8_8_ + 1);
                  if (uVar9 != 0) {
                    *(uint *)(local_188._0_8_ + (local_188._8_8_ - 1) * 4) = uVar7;
                  }
                  puVar30 = (uint *)((long)puVar30 + 1);
                } while (local_200 != puVar30);
              }
              puVar30 = tree_d.lengths;
              if (uVar8 != 0) {
                uVar26 = 0;
                do {
                  uVar7 = puVar30[uVar26];
                  uVar8 = uivector_resize((uivector *)local_188,local_188._8_8_ + 1);
                  if (uVar8 != 0) {
                    *(uint *)(local_188._0_8_ + (local_188._8_8_ - 1) * 4) = uVar7;
                  }
                  uVar26 = uVar26 + 1;
                } while (uVar29 != uVar26);
              }
              uVar26 = (ulong)(uint)local_188._8_4_;
              puVar30 = local_1e0;
              if (uVar26 != 0) {
                uVar3 = local_188._0_8_;
                uVar27 = 0;
                do {
                  uVar7 = *(uint *)(uVar3 + uVar27 * 4);
                  uVar17 = uVar27 + 1;
                  if (uVar17 < uVar26) {
                    uVar21 = 0;
                    uVar16 = uVar17;
                    do {
                      if (*(uint *)(uVar3 + uVar16 * 4) != uVar7) break;
                      uVar21 = (ulong)((int)uVar21 + 1);
                      uVar16 = uVar17 + uVar21;
                    } while (uVar16 < uVar26);
                    uVar8 = (uint)uVar21;
                    if (uVar8 < 2 || uVar7 != 0) {
                      puVar30 = local_1e0;
                      if (uVar8 < 3) goto LAB_004cbc65;
                      uVar9 = uivector_resize((uivector *)local_228,local_228._8_8_ + 1);
                      if (uVar9 != 0) {
                        *(uint *)(local_228._0_8_ + (local_228._8_8_ - 1) * 4) = uVar7;
                      }
                      uVar17 = uVar21 / 6;
                      local_1d0 = uVar17;
                      if (5 < uVar8) {
                        do {
                          uVar7 = uivector_resize((uivector *)local_228,local_228._8_8_ + 1);
                          if (uVar7 != 0) {
                            *(uint *)(local_228._0_8_ + (local_228._8_8_ - 1) * 4) = 0x10;
                          }
                          uVar7 = uivector_resize((uivector *)local_228,local_228._8_8_ + 1);
                          if (uVar7 != 0) {
                            *(uint *)(local_228._0_8_ + (local_228._8_8_ - 1) * 4) = 3;
                          }
                          uVar17 = uVar17 - 1;
                        } while (uVar17 != 0);
                      }
                      uVar7 = uVar8 + (int)local_1d0 * -6;
                      if (uVar7 < 3) {
                        uVar21 = (ulong)(uVar8 - uVar7);
                      }
                      else {
                        uVar8 = uivector_resize((uivector *)local_228,local_228._8_8_ + 1);
                        if (uVar8 != 0) {
                          *(uint *)(local_228._0_8_ + (local_228._8_8_ - 1) * 4) = 0x10;
                        }
                        uVar8 = uivector_resize((uivector *)local_228,local_228._8_8_ + 1);
                        if (uVar8 != 0) {
                          *(uint *)(local_228._0_8_ + (local_228._8_8_ - 1) * 4) = uVar7 - 3;
                        }
                      }
                    }
                    else {
                      uVar7 = uVar8 + 1;
                      if (uVar7 < 0xb) {
                        uVar7 = uivector_resize((uivector *)local_228,local_228._8_8_ + 1);
                        if (uVar7 != 0) {
                          *(uint *)(local_228._0_8_ + (local_228._8_8_ - 1) * 4) = 0x11;
                        }
                        uVar7 = uivector_resize((uivector *)local_228,local_228._8_8_ + 1);
                        if (uVar7 != 0) {
                          *(uint *)(local_228._0_8_ + (local_228._8_8_ - 1) * 4) = uVar8 - 2;
                        }
                      }
                      else {
                        if (0x89 < uVar7) {
                          uVar7 = 0x8a;
                        }
                        uVar8 = uivector_resize((uivector *)local_228,local_228._8_8_ + 1);
                        if (uVar8 != 0) {
                          *(uint *)(local_228._0_8_ + (local_228._8_8_ - 1) * 4) = 0x12;
                        }
                        uVar8 = uivector_resize((uivector *)local_228,local_228._8_8_ + 1);
                        if (uVar8 != 0) {
                          *(uint *)(local_228._0_8_ + (local_228._8_8_ - 1) * 4) = uVar7 - 0xb;
                        }
                        uVar21 = (ulong)(uVar7 - 1);
                      }
                    }
                    uVar27 = uVar27 + uVar21;
                    puVar30 = local_1e0;
                  }
                  else {
LAB_004cbc65:
                    uVar8 = uivector_resize((uivector *)local_228,local_228._8_8_ + 1);
                    if (uVar8 != 0) {
                      *(uint *)(local_228._0_8_ + (local_228._8_8_ - 1) * 4) = uVar7;
                    }
                  }
                  uVar27 = uVar27 + 1;
                } while (uVar27 != uVar26);
              }
              puVar13 = local_238;
              puVar15 = (uint *)calloc(1,0x4c);
              if (puVar15 == (uint *)0x0) {
                puVar15 = (uint *)0x0;
                out = local_208;
                outsize = local_1f8;
              }
              else {
                uVar3 = local_228._8_8_;
                if ((uchar *)local_228._8_8_ != (uchar *)0x0) {
                  puVar12 = (uchar *)0x0;
                  do {
                    uVar7 = *(uint *)(local_228._0_8_ + puVar12 * 4);
                    puVar15[uVar7] = puVar15[uVar7] + 1;
                    puVar12 = puVar12 + (2 - (ulong)((ulong)uVar7 < 0x10));
                  } while (puVar12 != (uchar *)local_228._8_8_);
                }
                uVar7 = HuffmanTree_makeFromFrequencies(&tree_cl,puVar15,0x13,0x13,7);
                if (uVar7 == 0) {
                  uVar26 = (ulong)tree_cl.numcodes;
                  uVar7 = uivector_resize((uivector *)local_c8,uVar26);
                  out = local_208;
                  outsize = local_1f8;
                  if (uVar7 != 0) {
                    if (uVar26 != 0) {
                      lVar11 = 0;
                      do {
                        *(uint *)(local_c8._0_8_ + lVar11) =
                             tree_cl.lengths[*(uint *)((long)CLCL_ORDER + lVar11)];
                        lVar11 = lVar11 + 4;
                      } while (uVar26 << 2 != lVar11);
                    }
                    do {
                      sVar19 = local_230;
                      uVar5 = local_c8._0_8_;
                      if (((ulong)local_c8._8_8_ < 5) ||
                         (*(uint *)(local_c8._0_8_ + (local_c8._8_8_ - 1) * 4) != 0)) {
                        local_1d0 = local_c8._8_8_;
                        iVar28 = (int)local_240;
                        if ((local_230 & 7) == 0) {
                          puVar30 = (uint *)(local_260.size + 1);
                          uVar7 = ucvector_reserve(&local_260,(size_t)puVar30);
                          iVar28 = (int)local_240;
                          if (uVar7 != 0) {
                            (local_260.data + -1)[(long)puVar30] = '\0';
                            local_260.size = (size_t)puVar30;
                          }
                        }
                        iVar23 = (int)local_1d0;
                        (local_260.data + -1)[local_260.size] =
                             (local_260.data + -1)[local_260.size] |
                             (byte)(iVar28 << ((byte)sVar19 & 7));
                        if (((int)sVar19 + 1U & 7) == 0) {
                          puVar30 = (uint *)(local_260.size + 1);
                          uVar7 = ucvector_reserve(&local_260,(size_t)puVar30);
                          iVar23 = (int)local_1d0;
                          if (uVar7 != 0) {
                            (local_260.data + -1)[(long)puVar30] = '\0';
                            local_260.size = (size_t)puVar30;
                          }
                        }
                        if ((sVar19 + 2 & 7) == 0) {
                          local_240 = (uint *)(local_260.size + 1);
                          uVar7 = ucvector_reserve(&local_260,(size_t)local_240);
                          iVar23 = (int)local_1d0;
                          if (uVar7 != 0) {
                            local_260.size = (size_t)local_240;
                            (local_260.data + -1)[(long)local_240] = '\0';
                          }
                        }
                        puVar30 = local_200;
                        local_230 = sVar19 + 3;
                        local_240 = (uint *)uVar3;
                        (local_260.data + -1)[local_260.size] =
                             (local_260.data + -1)[local_260.size] |
                             '\x01' << ((byte)(sVar19 + 2) & 7);
                        uVar27 = (ulong)(iVar23 - 4) + 3;
                        uVar26 = 0;
                        goto LAB_004cc05a;
                      }
                      uVar7 = uivector_resize((uivector *)local_c8,local_c8._8_8_ - 1);
                      out = local_208;
                      puVar30 = local_1e0;
                      outsize = local_1f8;
                    } while (uVar7 != 0);
                  }
                }
                else {
                  local_248 = (uint *)CONCAT44(local_248._4_4_,uVar7);
                  out = local_208;
                  outsize = local_1f8;
                }
              }
            }
            else {
              puVar15 = (uint *)0x0;
              local_248 = (uint *)CONCAT44(local_248._4_4_,uVar7);
            }
          }
          else {
            local_1f0 = uVar27;
            local_1d8 = uVar26;
            uVar7 = encodeLZ77((uivector *)local_108,&local_60,in,uVar21,uVar16,
                               local_1e8->windowsize,local_1e8->minmatch,local_1e8->nicematch,
                               local_1e8->lazymatching);
            if (uVar7 == 0) goto LAB_004cb5d1;
            local_248 = (uint *)CONCAT44(local_248._4_4_,uVar7);
LAB_004cb998:
            puVar14 = (uint *)0x0;
LAB_004cb99b:
            puVar15 = (uint *)0x0;
            puVar30 = (uint *)0x0;
          }
          goto LAB_004cb9a0;
        }
        uVar8 = 0;
        if (local_1e8->btype == 1) {
          local_a8._0_8_ = lVar11;
          local_240 = (uint *)CONCAT44(local_240._4_4_,uVar7);
          tree_ll.lengths = (uint *)0x0;
          tree_d.lengths = (uint *)0x0;
          tree_ll.tree2d = (uint *)0x0;
          tree_ll.tree1d = (uint *)0x0;
          tree_d.tree2d = (uint *)0x0;
          tree_d.tree1d = (uint *)0x0;
          local_238 = puVar13;
          local_1f0 = uVar27;
          local_1d8 = uVar26;
          generateFixedLitLenTree(&tree_ll);
          generateFixedDistanceTree(&tree_d);
          sVar19 = local_230;
          puVar14 = (uint *)local_260.size;
          puVar13 = local_260.data;
          iVar28 = (int)local_240;
          if ((local_230 & 7) == 0) {
            puVar30 = (uint *)(local_260.size + 1);
            if (local_260.allocsize < puVar30) {
              local_200 = (uint *)((ulong)((long)puVar30 * 3) >> 1);
              if ((uint *)(local_260.allocsize * 2) < puVar30) {
                local_200 = puVar30;
              }
              local_248 = puVar30;
              puVar12 = (uchar *)realloc(local_260.data,(size_t)local_200);
              iVar28 = (int)local_240;
              if (puVar12 == (uchar *)0x0) goto LAB_004cb6c3;
              local_260.allocsize = (size_t)local_200;
              puVar30 = local_248;
              local_260.data = puVar12;
            }
            (local_260.data + -1)[(long)puVar30] = '\0';
            puVar13 = local_260.data;
            puVar14 = puVar30;
            iVar28 = (int)local_240;
            local_260.size = (size_t)puVar30;
          }
LAB_004cb6c3:
          sVar2 = local_260.size;
          (puVar13 + -1)[(long)puVar14] =
               (puVar13 + -1)[(long)puVar14] | (byte)(iVar28 << ((byte)sVar19 & 7));
          puVar30 = (uint *)local_260.data;
          puVar14 = (uint *)sVar2;
          if ((sVar19 + 1 & 7) == 0) {
            puVar14 = (uint *)(local_260.size + 1);
            if (local_260.allocsize < puVar14) {
              local_240 = (uint *)local_260.data;
              local_200 = (uint *)((ulong)((long)puVar14 * 3) >> 1);
              if ((uint *)(local_260.allocsize * 2) < puVar14) {
                local_200 = puVar14;
              }
              local_248 = puVar14;
              puVar13 = (uchar *)realloc(local_260.data,(size_t)local_200);
              puVar30 = local_240;
              puVar14 = (uint *)sVar2;
              if (puVar13 == (uchar *)0x0) goto LAB_004cb750;
              local_260.allocsize = (size_t)local_200;
              puVar14 = local_248;
              local_260.data = puVar13;
            }
            (local_260.data + -1)[(long)puVar14] = '\0';
            puVar30 = (uint *)local_260.data;
            local_260.size = (size_t)puVar14;
          }
LAB_004cb750:
          ((uchar *)((long)puVar30 + -1))[(long)puVar14] =
               ((uchar *)((long)puVar30 + -1))[(long)puVar14] | '\x01' << ((byte)(sVar19 + 1) & 7);
          if (((int)sVar19 + 2U & 7) == 0) {
            puVar30 = (uint *)(local_260.size + 1);
            puVar13 = local_260.data;
            puVar14 = (uint *)local_260.allocsize;
            if (local_260.allocsize < puVar30) {
              puVar14 = (uint *)((ulong)((long)puVar30 * 3) >> 1);
              if ((uint *)(local_260.allocsize * 2) < puVar30) {
                puVar14 = puVar30;
              }
              puVar13 = (uchar *)realloc(local_260.data,(size_t)puVar14);
              if (puVar13 == (uchar *)0x0) goto LAB_004cb7b4;
            }
            local_260.allocsize = (size_t)puVar14;
            local_260.data = puVar13;
            (local_260.data + -1)[(long)puVar30] = '\0';
            local_260.size = (size_t)puVar30;
          }
LAB_004cb7b4:
          puVar14 = tree_ll.lengths;
          puVar13 = local_238;
          local_230 = sVar19 + 3;
          if (local_1e8->use_lz77 == 0) {
            puVar30 = tree_ll.tree1d;
            if (uVar21 < uVar16) {
              lVar20 = 0;
              do {
                addHuffmanSymbol(&local_230,&local_260,puVar30[puVar13[lVar20]],
                                 puVar14[puVar13[lVar20]]);
                lVar20 = lVar20 + 1;
              } while (uVar17 + lVar11 != lVar20);
            }
LAB_004cb8f6:
            addHuffmanSymbol(&local_230,&local_260,puVar30[0x100],puVar14[0x100]);
            uVar8 = 0;
          }
          else {
            tree_cl.lengths = (uint *)0x0;
            tree_cl.tree2d = (uint *)0x0;
            tree_cl.tree1d = (uint *)0x0;
            uVar8 = encodeLZ77((uivector *)&tree_cl,&local_60,in,uVar21,uVar16,local_1e8->windowsize
                               ,local_1e8->minmatch,local_1e8->nicematch,local_1e8->lazymatching);
            puVar13 = local_238;
            if (uVar8 == 0) {
              writeLZ77data(&local_230,&local_260,(uivector *)&tree_cl,&tree_ll,&tree_d);
              free(tree_cl.tree2d);
              puVar30 = tree_ll.tree1d;
              puVar14 = tree_ll.lengths;
              goto LAB_004cb8f6;
            }
            free(tree_cl.tree2d);
            puVar30 = tree_ll.tree1d;
            puVar14 = tree_ll.lengths;
          }
          free(tree_ll.tree2d);
          free(puVar30);
          free(puVar14);
          free(tree_d.tree2d);
          free(tree_d.tree1d);
          free(tree_d.lengths);
          uVar29 = local_210;
          out = local_208;
          lVar11 = local_a8._0_8_;
          uVar26 = local_1d8;
          uVar27 = local_1f0;
          outsize = local_1f8;
        }
        goto LAB_004cba8d;
      }
      uVar8 = 0;
LAB_004cc238:
      free(local_b0);
      free(local_e0);
      free(local_d0);
      free(local_d8);
      free(__s_00);
      free(local_e8);
    }
  }
LAB_004cc28e:
  *out = local_260.data;
  *outsize = local_260.size;
  return uVar8;
  while (uVar16 = uVar27 & 0xffffffff, uVar27 = uVar27 - 1, uVar26 = uVar17 + 1,
        *(uint *)(uVar5 + uVar16 * 4) == 0) {
LAB_004cc05a:
    uVar17 = uVar26;
    if (uVar17 == iVar23 - 4) break;
  }
  iVar28 = (int)(uVar17 + 1);
  local_200 = (uint *)CONCAT44(local_200._4_4_,iVar23 + 1);
  local_248 = (uint *)CONCAT44(local_248._4_4_,(iVar23 - iVar28) + -3);
  addBitsToStream(&local_230,&local_260,(int)puVar30 - 0x101,5);
  addBitsToStream(&local_230,&local_260,(int)uVar29 - 1,5);
  addBitsToStream(&local_230,&local_260,(uint)local_248,4);
  if ((int)local_200 != iVar28) {
    uVar29 = 0;
    do {
      addBitsToStream(&local_230,&local_260,*(uint *)(uVar5 + uVar29 * 4),3);
      uVar29 = uVar29 + 1;
    } while ((uint)(iVar23 - (int)uVar17) != uVar29);
  }
  if (local_240 != (uint *)0x0) {
    uVar3 = local_228._0_8_;
    puVar13 = (uchar *)0x0;
    local_248 = tree_cl.tree1d;
    local_200 = tree_cl.lengths;
    do {
      addHuffmanSymbol(&local_230,&local_260,local_248[*(uint *)(uVar3 + puVar13 * 4)],
                       local_200[*(uint *)(uVar3 + puVar13 * 4)]);
      puVar30 = (uint *)(uVar3 + puVar13 * 4);
      if (*puVar30 - 0x10 < 3) {
        puVar12 = puVar13 + 1;
        puVar13 = puVar13 + 1;
        addBitsToStream(&local_230,&local_260,*(uint *)(uVar3 + puVar12 * 4),
                        *(size_t *)(&DAT_00a269f0 + (ulong)(*puVar30 - 0x10) * 8));
      }
      puVar13 = puVar13 + 1;
    } while ((uint *)puVar13 != local_240);
  }
  writeLZ77data(&local_230,&local_260,(uivector *)local_108,&tree_ll,&tree_d);
  if (tree_ll.lengths[0x100] == 0) {
    local_248 = (uint *)CONCAT44(local_248._4_4_,0x40);
    out = local_208;
    puVar30 = local_1e0;
    outsize = local_1f8;
    puVar13 = local_238;
  }
  else {
    addHuffmanSymbol(&local_230,&local_260,tree_ll.tree1d[0x100],tree_ll.lengths[0x100]);
    local_248 = (uint *)((ulong)local_248 & 0xffffffff00000000);
    out = local_208;
    puVar30 = local_1e0;
    outsize = local_1f8;
    puVar13 = local_238;
  }
LAB_004cb9a0:
  free((void *)local_108._0_8_);
  free(tree_ll.tree2d);
  free(tree_ll.tree1d);
  free(tree_ll.lengths);
  free(tree_d.tree2d);
  free(tree_d.tree1d);
  free(tree_d.lengths);
  free(tree_cl.tree2d);
  free(tree_cl.tree1d);
  free(tree_cl.lengths);
  free(puVar14);
  free(puVar30);
  free(puVar15);
  free((void *)local_228._0_8_);
  free((void *)local_188._0_8_);
  free((void *)local_c8._0_8_);
  uVar29 = local_210;
  lVar11 = local_a8._0_8_;
  uVar26 = local_1d8;
  uVar27 = local_1f0;
  uVar8 = (uint)local_248;
LAB_004cba8d:
  uVar27 = uVar27 + 1;
  if (uVar27 == uVar24) goto LAB_004cc238;
  uVar26 = uVar26 + sVar25;
  lVar11 = lVar11 - sVar25;
  puVar13 = puVar13 + sVar25;
  if (uVar8 != 0) goto LAB_004cc238;
  goto LAB_004cb36c;
}

Assistant:

unsigned lodepng_deflate(unsigned char** out, size_t* outsize,
                         const unsigned char* in, size_t insize,
                         const LodePNGCompressSettings* settings)
{
  unsigned error;
  ucvector v;
  ucvector_init_buffer(&v, *out, *outsize);
  error = lodepng_deflatev(&v, in, insize, settings);
  *out = v.data;
  *outsize = v.size;
  return error;
}